

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

void game_run(_func_void *eventpoll,_func_void *draw)

{
  int iVar1;
  int local_1c;
  uint32_t now_ticks;
  uint32_t last_ticks;
  _func_void *draw_local;
  _func_void *eventpoll_local;
  
  local_1c = SDL_GetTicks();
  while (g.state != QUIT) {
    if (g.state == INIT) {
      game_init();
    }
    else {
      (*eventpoll)();
      if (g.state == MENU) {
        if (g.level < 3) {
          if (g.level < 0) {
            g.level = 2;
          }
        }
        else {
          g.level = 0;
        }
      }
      else if ((g.state == RUNNING) &&
              ((iVar1 = SDL_GetTicks(), (force_update & 1U) != 0 ||
               (levels[g.level].update_ms < (uint)(iVar1 - local_1c))))) {
        force_update = false;
        game_update();
        local_1c = iVar1;
      }
      (*draw)();
    }
  }
  game_quit();
  return;
}

Assistant:

void game_run(void (*eventpoll)(void), void (*draw)(void)) {
    uint32_t last_ticks = SDL_GetTicks();
    while (g.state != QUIT) {
        if (g.state == INIT) {
            game_init();
            continue;
        }
        
        eventpoll();

        if (g.state == MENU) {
            if ((signed int) g.level > nlevels-1)
                g.level = 0;
            else if ((signed int) g.level < 0)
                g.level = nlevels-1;
        } else if (g.state == RUNNING) {
            uint32_t now_ticks = SDL_GetTicks();
            if (force_update || now_ticks - last_ticks > levels[g.level].update_ms) {
                /* Update. */
                force_update = false;
                last_ticks = now_ticks;
                game_update();
            }
        }

        draw();
    }

    game_quit();
}